

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

void __thiscall
Catch::SonarQubeReporter::testRunStarting(SonarQubeReporter *this,TestRunInfo *testRunInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IConfig *pIVar2;
  ostream *out;
  StringRef text;
  int iVar3;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar4;
  size_t sVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XmlWriter *this_00;
  StringRef name;
  string local_48;
  ReusableStringStream local_28;
  
  pIVar2 = (this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_config;
  pSVar4 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar5 = StringStreams::add(&pSVar4->super_StringStreams);
  local_28.m_index = sVar5;
  pSVar4 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  out = (ostream *)
        (pSVar4->super_StringStreams).m_streams.
        super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar5].m_ptr;
  local_28.m_oss = out;
  iVar3 = (*pIVar2->_vptr_IConfig[0xd])(pIVar2);
  if (*(long *)CONCAT44(extraout_var,iVar3) != ((long *)CONCAT44(extraout_var,iVar3))[1]) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"filters=\'",9);
    iVar3 = (*pIVar2->_vptr_IConfig[0xd])(pIVar2);
    TestSpec::serializeTo((TestSpec *)CONCAT44(extraout_var_00,iVar3),out);
    std::__ostream_insert<char,std::char_traits<char>>(out,"\' ",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"rng-seed=",9);
  (*pIVar2->_vptr_IConfig[0x11])(pIVar2);
  std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__cxx11::stringbuf::str();
  this_00 = &this->xml;
  ReusableStringStream::~ReusableStringStream(&local_28);
  text.m_start._1_7_ = local_48._M_dataplus._M_p._1_7_;
  text.m_start._0_1_ = local_48._M_dataplus._M_p._0_1_;
  text.m_size = local_48._M_string_length;
  XmlWriter::writeComment(this_00,text,Newline|Indent);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p._0_1_ = SUB81(paVar1,0);
  local_48._M_dataplus._M_p._1_7_ = (undefined7)((ulong)paVar1 >> 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"testExecutions","");
  XmlWriter::startElement(this_00,&local_48,Newline|Indent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_48._M_dataplus._M_p._1_7_,local_48._M_dataplus._M_p._0_1_),
                    local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p._0_1_ = 0x31;
  name.m_size = 7;
  name.m_start = "version";
  XmlWriter::writeAttribute<char,void>(this_00,name,(char *)&local_48);
  return;
}

Assistant:

void SonarQubeReporter::testRunStarting(TestRunInfo const& testRunInfo) {
        CumulativeReporterBase::testRunStarting(testRunInfo);

        xml.writeComment( createMetadataString( *m_config ) );
        xml.startElement("testExecutions");
        xml.writeAttribute("version"_sr, '1');
    }